

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

void __thiscall AutoFile::seek(AutoFile *this,int64_t offset,int origin)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  error_code *this_00;
  int in_EDX;
  FILE *in_RSI;
  FILE *__stream;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  int64_t r;
  AutoFile *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  io_errc in_stack_ffffffffffffff14;
  error_code *in_stack_ffffffffffffff18;
  error_code *peVar9;
  _Storage<long,_true> local_28;
  undefined8 local_20;
  _Storage<long,_true> local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsNull(in_stack_ffffffffffffff08);
  if (bVar2) {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"AutoFile::seek: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    __stream = in_RSI;
    iVar3 = fseek((FILE *)in_RDI->m_file,(long)in_RSI,in_EDX);
    if (iVar3 == 0) {
      if (in_EDX == 0) {
        std::optional<long>::optional<long_&,_true>
                  ((optional<long> *)in_stack_ffffffffffffff18,
                   (long *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        (in_RDI->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = local_18;
        *(undefined8 *)
         &(in_RDI->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = local_10;
      }
      else if ((in_EDX == 1) &&
              (bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffff08),
              bVar2)) {
        plVar7 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff08);
        *plVar7 = (long)&in_RSI->_flags + *plVar7;
      }
      else {
        lVar8 = ftell((FILE *)in_RDI->m_file);
        if (lVar8 < 0) {
          this_00 = (error_code *)__cxa_allocate_exception(0x20);
          peVar9 = this_00;
          std::error_code::error_code<std::io_errc,void>(this_00,in_stack_ffffffffffffff14);
          std::ios_base::failure[abi:cxx11]::failure
                    ((char *)this_00,(error_code *)"AutoFile::seek: ftell failed");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(peVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_00892883;
        }
        std::optional<long>::optional<long_&,_true>
                  ((optional<long> *)in_stack_ffffffffffffff18,
                   (long *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        (in_RDI->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload = local_28;
        *(undefined8 *)
         &(in_RDI->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = local_20;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      uVar4 = feof(in_RDI,__stream);
      pcVar6 = "AutoFile::seek: fseek failed";
      if ((uVar4 & 1) != 0) {
        pcVar6 = "AutoFile::seek: end of file";
      }
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)pcVar6);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
LAB_00892883:
  __stack_chk_fail();
}

Assistant:

void AutoFile::seek(int64_t offset, int origin)
{
    if (IsNull()) {
        throw std::ios_base::failure("AutoFile::seek: file handle is nullptr");
    }
    if (std::fseek(m_file, offset, origin) != 0) {
        throw std::ios_base::failure(feof() ? "AutoFile::seek: end of file" : "AutoFile::seek: fseek failed");
    }
    if (origin == SEEK_SET) {
        m_position = offset;
    } else if (origin == SEEK_CUR && m_position.has_value()) {
        *m_position += offset;
    } else {
        int64_t r{std::ftell(m_file)};
        if (r < 0) {
            throw std::ios_base::failure("AutoFile::seek: ftell failed");
        }
        m_position = r;
    }
}